

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O1

uint32_t query_heuristic_cost(Query *q)

{
  QueryType *pQVar1;
  PrimitiveQuery PVar2;
  runtime_error *this;
  uint32_t uVar3;
  
  pQVar1 = Query::get_type(q);
  uVar3 = 0x4000000;
  switch(*pQVar1) {
  case PRIMITIVE:
    PVar2 = Query::as_ngram(q);
    switch(PVar2.itype) {
    case GRAM3:
      PVar2 = Query::as_ngram(q);
      uVar3 = PVar2.trigram + 0x3000000;
      break;
    case TEXT4:
      PVar2 = Query::as_ngram(q);
      uVar3 = PVar2.trigram + 0x1000000;
      break;
    case HASH4:
      PVar2 = Query::as_ngram(q);
      uVar3 = PVar2.trigram + 0x2000000;
      break;
    case WIDE8:
      PVar2 = Query::as_ngram(q);
      uVar3 = PVar2.trigram;
    }
    break;
  case AND:
    break;
  case OR:
    uVar3 = 0x6000000;
    break;
  case MIN_OF:
    uVar3 = 0x5000000;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unexpected query/index type.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return uVar3;
}

Assistant:

uint32_t query_heuristic_cost(const Query &q) {
    // From empirical test, order of query types doesn't seem to matter much.
    switch (q.get_type()) {
        case QueryType::PRIMITIVE:
            // Sort by ngram type, then by ngram value, alphabetically first.
            // This is (un)surprisingly important for two reasons:
            // 1. we read sequentially as many ngrams as possible.
            // 2. consecutive ngrams are independent: (abc, bcd) vs (abc, def).
            // Use smaller indexes first, because they're faster to read.
            switch (q.as_ngram().itype) {
                case IndexType::WIDE8:
                    return (0 << 24) + q.as_ngram().trigram;
                case IndexType::TEXT4:
                    return (1 << 24) + q.as_ngram().trigram;
                case IndexType::HASH4:
                    return (2 << 24) + q.as_ngram().trigram;
                case IndexType::GRAM3:
                    return (3 << 24) + q.as_ngram().trigram;
            }
        case QueryType::AND:
            return 4 << 24;
        case QueryType::MIN_OF:
            return 5 << 24;
        case QueryType::OR:
            // OR is the worst operation, since it always needs to scan
            // all of its arguments (no chance of early exit).
            return 6 << 24;
    }
    throw std::runtime_error("Unexpected query/index type.");
}